

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

void __thiscall inja::Parser::append_function(Parser *this,Template *tmpl,Op op,uint num_args)

{
  bool bVar1;
  reference pvVar2;
  Bytecode *last;
  uint num_args_local;
  Op op_local;
  Template *tmpl_local;
  Parser *this_local;
  
  last._0_4_ = num_args;
  last._7_1_ = op;
  _num_args_local = tmpl;
  tmpl_local = (Template *)this;
  bVar1 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::empty(&tmpl->bytecodes);
  if ((bVar1) ||
     (pvVar2 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::back
                         (&_num_args_local->bytecodes), pvVar2->op != Push)) {
    std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
    emplace_back<inja::Bytecode::Op&,unsigned_int&>
              ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)_num_args_local,
               (Op *)((long)&last + 7),(uint *)&last);
  }
  else {
    pvVar2->op = last._7_1_;
    *(uint *)&pvVar2->field_0x4 = *(uint *)&pvVar2->field_0x4 & 0xc0000000 | (uint)last & 0x3fffffff
    ;
  }
  return;
}

Assistant:

void append_function(Template& tmpl, Bytecode::Op op, unsigned int num_args) {
		// we can merge with back-to-back push
		if (!tmpl.bytecodes.empty()) {
			Bytecode& last = tmpl.bytecodes.back();
			if (last.op == Bytecode::Op::Push) {
				last.op = op;
				last.args = num_args;
				return;
			}
		}

		// otherwise just add it to the end
		tmpl.bytecodes.emplace_back(op, num_args);
	}